

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressTestUtil.cpp
# Opt level: O0

ProgramContext * __thiscall
deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferContext
          (ProgramContext *__return_storage_ptr__,ProgramLibrary *this,int numDummyAttributes)

{
  mapped_type *pmVar1;
  char *fragShaderSource_;
  char *pcVar2;
  Vector<float,_4> local_498;
  Vector<float,_4> local_488;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  VarSpec local_438;
  int local_390;
  int i_1;
  Vector<float,_3> local_380;
  allocator<char> local_371;
  string local_370;
  VarSpec local_350;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  undefined1 local_212;
  allocator<char> local_211;
  key_type local_210;
  allocator<char> local_1e9;
  key_type local_1e8;
  string local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  int local_94;
  string local_90 [4];
  int i;
  string vtxColorExpr;
  string vtxDummyInputs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  firstLevelParams;
  int numDummyAttributes_local;
  ProgramLibrary *this_local;
  ProgramContext *context;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)((long)&vtxDummyInputs.field_2 + 8));
  std::__cxx11::string::string((string *)(vtxColorExpr.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_90);
  for (local_94 = 0; local_94 < numDummyAttributes; local_94 = local_94 + 1) {
    de::toString<int>(&local_f8,&local_94);
    std::operator+(&local_d8,"${VTX_IN} mediump vec4 a_in",&local_f8);
    std::operator+(&local_b8,&local_d8,";\n");
    std::__cxx11::string::operator+=
              ((string *)(vtxColorExpr.field_2._M_local_buf + 8),(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::string((string *)&local_188);
    pcVar2 = "";
    if (0 < local_94) {
      pcVar2 = " + ";
    }
    std::operator+(&local_168,&local_188,pcVar2);
    std::operator+(&local_148,&local_168,"a_in");
    de::toString<int>(&local_1a8,&local_94);
    std::operator+(&local_128,&local_148,&local_1a8);
    std::__cxx11::string::operator+=(local_90,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
  }
  substitute(&local_1c8,this,(string *)((long)&vtxColorExpr.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"VTX_DUMMY_INPUTS",&local_1e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&vtxDummyInputs.field_2 + 8),&local_1e8);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"VTX_COLOR_EXPRESSION",&local_211);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&vtxDummyInputs.field_2 + 8),&local_210);
  std::__cxx11::string::operator=((string *)pmVar1,local_90);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)(vtxColorExpr.field_2._M_local_buf + 8));
  local_212 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "${VTX_HEADER}${VTX_IN} highp vec3 a_position;\n${VTX_DUMMY_INPUTS}${VTX_OUT} mediump vec4 v_color;\n\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 1.0);\n\tv_color = ${VTX_COLOR_EXPRESSION};\n}\n"
             ,&local_259);
  substitute(&local_238,this,&local_258,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&vtxDummyInputs.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,
             "${FRAG_HEADER}${FRAG_IN} mediump vec4 v_color;\n\nvoid main (void)\n{\n\t${FRAG_COLOR} = v_color;\n}\n"
             ,&local_2a1);
  substitute(&local_280,this,&local_2a0);
  fragShaderSource_ = (char *)std::__cxx11::string::c_str();
  gls::ProgramContext::ProgramContext(__return_storage_ptr__,pcVar2,fragShaderSource_,"a_position");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"a_position",&local_371);
  tcu::Vector<float,_3>::Vector(&local_380,-0.1);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&stack0xfffffffffffffc74,0.1);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            (&local_350,&local_370,&local_380,(Vector<float,_3> *)&stack0xfffffffffffffc74);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->attributes,&local_350);
  VarSpec::~VarSpec(&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  for (local_390 = 0; local_390 < numDummyAttributes; local_390 = local_390 + 1) {
    de::toString<int>(&local_478,&local_390);
    std::operator+(&local_458,"a_in",&local_478);
    tcu::Vector<float,_4>::Vector(&local_488,0.0);
    tcu::Vector<float,_4>::Vector(&local_498,1.0 / (float)numDummyAttributes);
    VarSpec::VarSpec<tcu::Vector<float,4>>(&local_438,&local_458,&local_488,&local_498);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
              (&__return_storage_ptr__->attributes,&local_438);
    VarSpec::~VarSpec(&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
  }
  local_212 = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)((long)&vtxDummyInputs.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

gls::ProgramContext ProgramLibrary::generateBufferContext (const int numDummyAttributes) const
{
	static const char* const vertexTemplate =
		"${VTX_HEADER}"
		"${VTX_IN} highp vec3 a_position;\n"
		"${VTX_DUMMY_INPUTS}"
		"${VTX_OUT} mediump vec4 v_color;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_position, 1.0);\n"
		"	v_color = ${VTX_COLOR_EXPRESSION};\n"
		"}\n";

	static const char* const fragmentTemplate =
		"${FRAG_HEADER}"
		"${FRAG_IN} mediump vec4 v_color;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	${FRAG_COLOR} = v_color;\n"
		"}\n";

	map<string, string> firstLevelParams;

	{
		string vtxDummyInputs;
		string vtxColorExpr;
		for (int i = 0; i < numDummyAttributes; i++)
		{
			vtxDummyInputs	+= "${VTX_IN} mediump vec4 a_in" + toString(i) + ";\n";
			vtxColorExpr	+= string() + (i > 0 ? " + " : "") + "a_in" + toString(i);
		}

		firstLevelParams["VTX_DUMMY_INPUTS"]		= substitute(vtxDummyInputs);
		firstLevelParams["VTX_COLOR_EXPRESSION"]	= vtxColorExpr;
	}

	gls::ProgramContext context(substitute(vertexTemplate, firstLevelParams).c_str(), substitute(fragmentTemplate).c_str(), "a_position");

	context.attributes.push_back(gls::VarSpec("a_position", Vec3(-0.1f), Vec3(0.1f)));

	for (int i = 0; i < numDummyAttributes; i++)
		context.attributes.push_back(gls::VarSpec("a_in" + de::toString(i), Vec4(0.0f), Vec4(1.0f / (float)numDummyAttributes)));

	return context;
}